

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.h
# Opt level: O3

void __thiscall
rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::~GenericRegex
          (GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this)

{
  operator_delete(this->ownAllocator_,1);
  free((this->ranges_).stack_);
  operator_delete((this->ranges_).ownAllocator_,1);
  free((this->states_).stack_);
  operator_delete((this->states_).ownAllocator_,1);
  return;
}

Assistant:

~GenericRegex()
    {
        RAPIDJSON_DELETE(ownAllocator_);
    }